

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O0

void __thiscall SkipList::put(SkipList *this,uint64_t key,string *value)

{
  long lVar1;
  reference ppNVar2;
  Node *pNVar3;
  bool bVar4;
  byte local_f2;
  string local_e0 [39];
  undefined1 local_b9;
  string local_b8 [32];
  Node *local_98;
  Node *down;
  undefined4 local_88;
  bool grow;
  Node *local_78;
  Node *p;
  stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_> path;
  string *value_local;
  uint64_t key_local;
  SkipList *this_local;
  
  path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)value;
  std::stack<SkipList::Node*,std::deque<SkipList::Node*,std::allocator<SkipList::Node*>>>::
  stack<std::deque<SkipList::Node*,std::allocator<SkipList::Node*>>,void>
            ((stack<SkipList::Node*,std::deque<SkipList::Node*,std::allocator<SkipList::Node*>>> *)
             &p);
  local_78 = this->head;
  do {
    if (local_78 == (Node *)0x0) {
      down._7_1_ = true;
      local_98 = (Node *)0x0;
      while( true ) {
        local_f2 = 0;
        if ((bool)down._7_1_ != false) {
          bVar4 = std::
                  stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
                  ::empty((stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
                           *)&p);
          local_f2 = bVar4 ^ 0xff;
        }
        if ((local_f2 & 1) == 0) break;
        ppNVar2 = std::
                  stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
                  ::top((stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
                         *)&p);
        local_78 = *ppNVar2;
        std::
        stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>::
        pop((stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
             *)&p);
        pNVar3 = (Node *)operator_new(0x38);
        local_b9 = 1;
        std::__cxx11::string::string
                  (local_b8,(string *)
                            path.c.
                            super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>.
                            _M_impl.super__Deque_impl_data._M_finish._M_node);
        Node::Node(pNVar3,key,(string *)local_b8,local_78->right,local_98);
        local_b9 = 0;
        local_78->right = pNVar3;
        std::__cxx11::string::~string(local_b8);
        local_98 = local_78->right;
        down._7_1_ = shouldGrowUp(this);
      }
      if ((down._7_1_ & 1) != 0) {
        local_78 = this->head;
        pNVar3 = (Node *)operator_new(0x38);
        Node::Node(pNVar3);
        this->head = pNVar3;
        pNVar3 = (Node *)operator_new(0x38);
        std::__cxx11::string::string
                  (local_e0,(string *)
                            path.c.
                            super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>.
                            _M_impl.super__Deque_impl_data._M_finish._M_node);
        Node::Node(pNVar3,key,(string *)local_e0,(Node *)0x0,local_98);
        this->head->right = pNVar3;
        std::__cxx11::string::~string(local_e0);
        this->head->down = local_78;
      }
      this->length = this->length + 1;
      lVar1 = std::__cxx11::string::size();
      this->valueSize = lVar1 + this->valueSize;
      local_88 = 0;
LAB_0010f51c:
      std::stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
      ::~stack((stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
                *)&p);
      return;
    }
    while( true ) {
      bVar4 = false;
      if (local_78->right != (Node *)0x0) {
        bVar4 = local_78->right->key < key;
      }
      if (!bVar4) break;
      local_78 = local_78->right;
    }
    if ((local_78->right != (Node *)0x0) && (local_78->right->key == key)) {
      lVar1 = std::__cxx11::string::size();
      this->valueSize = this->valueSize - lVar1;
      lVar1 = std::__cxx11::string::size();
      this->valueSize = this->valueSize + lVar1;
      put::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&put(unsigned_long,std::__cxx11::string_const&)::update,
                 local_78->right,
                 (string *)
                 path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node);
      local_88 = 1;
      goto LAB_0010f51c;
    }
    std::stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>::
    push((stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
          *)&p,&local_78);
    local_78 = local_78->down;
  } while( true );
}

Assistant:

void SkipList::put(uint64_t key, const string &value) {
  // if key exists, update the value of all nodes
  static auto update = [](Node *p, const string &value) {
    while (p) {
      p->value = value;
      p = p->down;
    }
  };

  // find the place to insert
  stack<Node *> path;
  Node *p = head;
  while (p) {
    while (p->right && p->right->key < key) p = p->right;
    // if key exists
    if (p->right && p->right->key == key) {
      valueSize -= p->right->value.size();
      valueSize += value.size();
      update(p->right, value);
      return;
    }
    path.push(p);
    p = p->down;
  }

  // insert and grow up
  bool grow = true;
  Node *down = nullptr;
  while (grow && !path.empty()) {
    p = path.top();
    path.pop();
    p->right = new Node(key, value, p->right, down);
    down = p->right;
    grow = shouldGrowUp();
  }

  // height + 1
  if (grow) {
    p = head;
    head = new Node;
    head->right = new Node(key, value, nullptr, down);
    head->down = p;
  }

  length++;
  valueSize += value.size();
}